

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int QMetaTypeIdQObject<QDnsTlsAssociationRecord,_512>::qt_metatype_id(void)

{
  Type TVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    pcVar2 = (char *)QMetaObject::className();
    QByteArray::QByteArray((QByteArray *)&local_30,pcVar2,-1);
    TVar1.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         qRegisterNormalizedMetaTypeImplementation<QDnsTlsAssociationRecord>
                   ((QByteArray *)&local_30);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
    qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i =
         (Type)(Type)TVar1.super___atomic_base<int>._M_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }